

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<8>
embree::avx::GeneralBVHBuilder::
build<embree::NodeRefPtr<8>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>,embree::Scene::BuildProgressMonitorInterface>
          (HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *heuristic,PrimRef *prims,undefined8 *set,Create createAlloc,
          CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>
          *param_5,BuildProgressMonitorInterface *param_6,Settings *param_7)

{
  undefined1 auVar1 [24];
  NodeRefPtr<8> NVar2;
  DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange> local_14b;
  Set2 local_14a;
  Create2 local_149;
  undefined1 local_148 [16];
  undefined8 local_138;
  CreateAlloc createAlloc_local;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_128;
  Builder builder;
  
  createAlloc_local.super_Create.allocator = (Create)(Create)createAlloc.allocator;
  BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
  ::BuilderT(&builder,prims,heuristic,&createAlloc_local,&local_149,&local_14a,param_5,
             (DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange> *)&local_128,
             &local_14b,param_6,param_7);
  local_128.depth = 1;
  local_128.alloc_barrier = false;
  local_128.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = *set;
  local_128.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = set[1];
  local_128.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = set[2];
  local_128.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ = set[3];
  local_128.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = set[4];
  local_128.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = set[5];
  local_128.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ = set[6];
  local_128.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ = set[7];
  local_128.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = set[8];
  local_128.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = set[9];
  local_128.prims.super_extended_range<unsigned_long>._ext_end = set[10];
  local_138 = 0;
  local_148._8_8_ = SUB168(ZEXT816(0),4);
  auVar1 = ZEXT824((ulong)local_148._8_8_);
  local_148 = ZEXT816(0) << 0x20;
  NVar2 = BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
          ::recurse(&builder,&local_128,(CachedAllocator)(auVar1 << 0x40),true);
  return (NodeRefPtr<8>)NVar2.ptr;
}

Assistant:

__noinline static ReductionTy build(Heuristic& heuristic,
                                            PrimRef* prims,
                                            const Set& set,
                                            CreateAllocFunc createAlloc,
                                            CreateNodeFunc createNode, UpdateNodeFunc updateNode,
                                            const CreateLeafFunc& createLeaf,
                                            const ProgressMonitor& progressMonitor,
                                            const Settings& settings)
      {
        typedef BuildRecordT<Set,typename Heuristic::Split> BuildRecord;

        typedef BuilderT<
          BuildRecord,
          Heuristic,
          Set,
          PrimRef,
          ReductionTy,
          decltype(createAlloc()),
          CreateAllocFunc,
          CreateNodeFunc,
          UpdateNodeFunc,
          CreateLeafFunc,
          DefaultCanCreateLeafFunc<PrimRef, Set>,
          DefaultCanCreateLeafSplitFunc<PrimRef, Set>,
          ProgressMonitor> Builder;

        /* instantiate builder */
        Builder builder(prims,
                        heuristic,
                        createAlloc,
                        createNode,
                        updateNode,
                        createLeaf,
                        DefaultCanCreateLeafFunc<PrimRef, Set>(),
                        DefaultCanCreateLeafSplitFunc<PrimRef, Set>(),
                        progressMonitor,
                        settings);

        /* build hierarchy */
        BuildRecord record(1,set);
        const ReductionTy root = builder.recurse(record,nullptr,true);
        _mm_mfence(); // to allow non-temporal stores during build
        return root;
      }